

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_check_chunk_length(png_const_structrp png_ptr,png_uint_32 length)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  size_t row_factor;
  png_alloc_size_t idat_limit;
  png_alloc_size_t limit;
  png_uint_32 length_local;
  png_const_structrp png_ptr_local;
  
  idat_limit = 0x7fffffff;
  if ((png_ptr->user_chunk_malloc_max != 0) && (png_ptr->user_chunk_malloc_max < 0x7fffffff)) {
    idat_limit = png_ptr->user_chunk_malloc_max;
  }
  if (png_ptr->chunk_name == 0x49444154) {
    iVar2 = 1;
    if (8 < png_ptr->bit_depth) {
      iVar2 = 2;
    }
    iVar3 = 0;
    if (png_ptr->interlaced != '\0') {
      iVar3 = 6;
    }
    local_40 = (ulong)png_ptr->width * (ulong)png_ptr->channels * (long)iVar2 + 1 + (long)iVar3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_40;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar1,0) < (ulong)png_ptr->height) {
      row_factor = 0x7fffffff;
    }
    else {
      row_factor = png_ptr->height * local_40;
    }
    if (0x7f36 < local_40) {
      local_40 = 0x7f36;
    }
    local_48 = (row_factor / local_40 + 1) * 5 + 6 + row_factor;
    if (0x7ffffffe < local_48) {
      local_48 = 0x7fffffff;
    }
    if (idat_limit < local_48) {
      local_50 = local_48;
    }
    else {
      local_50 = idat_limit;
    }
    idat_limit = local_50;
  }
  if (length <= idat_limit) {
    return;
  }
  png_chunk_error(png_ptr,"chunk data is too large");
}

Assistant:

void /* PRIVATE */
png_check_chunk_length(png_const_structrp png_ptr, png_uint_32 length)
{
   png_alloc_size_t limit = PNG_UINT_31_MAX;

# ifdef PNG_SET_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_malloc_max > 0 &&
       png_ptr->user_chunk_malloc_max < limit)
      limit = png_ptr->user_chunk_malloc_max;
# elif PNG_USER_CHUNK_MALLOC_MAX > 0
   if (PNG_USER_CHUNK_MALLOC_MAX < limit)
      limit = PNG_USER_CHUNK_MALLOC_MAX;
# endif
   if (png_ptr->chunk_name == png_IDAT)
   {
      png_alloc_size_t idat_limit = PNG_UINT_31_MAX;
      size_t row_factor =
         (size_t)png_ptr->width
         * (size_t)png_ptr->channels
         * (png_ptr->bit_depth > 8? 2: 1)
         + 1
         + (png_ptr->interlaced? 6: 0);
      if (png_ptr->height > PNG_UINT_32_MAX/row_factor)
         idat_limit = PNG_UINT_31_MAX;
      else
         idat_limit = png_ptr->height * row_factor;
      row_factor = row_factor > 32566? 32566 : row_factor;
      idat_limit += 6 + 5*(idat_limit/row_factor+1); /* zlib+deflate overhead */
      idat_limit=idat_limit < PNG_UINT_31_MAX? idat_limit : PNG_UINT_31_MAX;
      limit = limit < idat_limit? idat_limit : limit;
   }

   if (length > limit)
   {
      png_debug2(0," length = %lu, limit = %lu",
         (unsigned long)length,(unsigned long)limit);
      png_chunk_error(png_ptr, "chunk data is too large");
   }
}